

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> * __thiscall
LongReadsMapper::create_read_paths
          (vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<long,_std::allocator<long>_> *backbone,
          vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          *filtered_read_mappings,ReadPathParams *read_path_params)

{
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_00;
  long lVar1;
  pointer pvVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  pointer plVar7;
  __node_base_ptr p_Var8;
  char *pcVar9;
  pointer pRVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  __node_base_ptr p_Var14;
  unsigned_long *__args;
  bool bVar15;
  string seq;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  useful_read;
  ReadSequenceBuffer sequenceGetter;
  allocator local_101;
  LongReadsMapper *local_100;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  vector<long,_std::allocator<long>_> *local_d0;
  ReadPathParams *local_c8;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> local_c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  ReadSequenceBuffer local_70;
  
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = this;
  local_f8 = filtered_read_mappings;
  local_c8 = read_path_params;
  ReadSequenceBuffer::ReadSequenceBuffer(&local_70,this->datastore,0x1e00000,0x400000);
  plVar7 = (backbone->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((backbone->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish != plVar7) {
    uVar12 = 0;
    local_d0 = backbone;
    do {
      lVar1 = plVar7[uVar12];
      lVar11 = -lVar1;
      if (0 < lVar1) {
        lVar11 = lVar1;
      }
      pvVar2 = (local_100->reads_in_node).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = *(pointer *)
                ((long)&pvVar2[lVar11].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (__args = pvVar2[lVar11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != puVar3; __args = __args + 1
          ) {
        p_Var4 = (_Hash_node_base *)*__args;
        p_Var5 = local_a8._M_buckets[(ulong)p_Var4 % local_a8._M_bucket_count];
        p_Var8 = (__node_base_ptr)0x0;
        if ((p_Var5 != (__node_base_ptr)0x0) &&
           (p_Var8 = p_Var5, p_Var14 = p_Var5->_M_nxt, p_Var4 != p_Var5->_M_nxt[1]._M_nxt)) {
          while (p_Var6 = p_Var14->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var8 = (__node_base_ptr)0x0;
            if (((ulong)p_Var6[1]._M_nxt % local_a8._M_bucket_count !=
                 (ulong)p_Var4 % local_a8._M_bucket_count) ||
               (p_Var8 = p_Var14, p_Var14 = p_Var6, p_Var4 == p_Var6[1]._M_nxt)) goto LAB_001a786e;
          }
          p_Var8 = (__node_base_ptr)0x0;
        }
LAB_001a786e:
        if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_long_const&>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_a8,__args);
          pcVar9 = ReadSequenceBuffer::get_read_sequence(&local_70,*__args);
          std::__cxx11::string::string((string *)&local_f0,pcVar9,&local_101);
          std::vector<ReadCacheItem,std::allocator<ReadCacheItem>>::
          emplace_back<unsigned_long_const&,std::__cxx11::string&>
                    ((vector<ReadCacheItem,std::allocator<ReadCacheItem>> *)__return_storage_ptr__,
                     __args,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      plVar7 = (local_d0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(local_d0->super__Vector_base<long,_std::allocator<long>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar7 >> 3));
  }
  this_00 = &local_100->read_paths;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize(this_00,((long)(local_f8->
                          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_f8->
                          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pRVar10 = (__return_storage_ptr__->
            super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
      _M_impl.super__Vector_impl_data._M_finish != pRVar10) {
    uVar12 = 0;
    uVar13 = 1;
    do {
      std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
                (&local_c0,
                 (local_f8->
                 super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + pRVar10[uVar12].id);
      create_read_path((vector<long,_std::allocator<long>_> *)&local_f0,local_100,&local_c0,local_c8
                       ,false,&(__return_storage_ptr__->
                               super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar12].seq);
      std::vector<long,_std::allocator<long>_>::_M_move_assign
                ((this_00->
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start +
                 (__return_storage_ptr__->
                 super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12].id,&local_f0);
      if (local_f0._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_f0._M_dataplus._M_p,
                        local_f0.field_2._M_allocated_capacity - (long)local_f0._M_dataplus._M_p);
      }
      if (local_c0.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.
                        super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pRVar10 = (__return_storage_ptr__->
                super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = ((long)(__return_storage_ptr__->
                      super__Vector_base<ReadCacheItem,_std::allocator<ReadCacheItem>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pRVar10 >> 3) * -0x3333333333333333;
      bVar15 = uVar13 <= uVar12;
      lVar1 = uVar12 - uVar13;
      uVar12 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar15 && lVar1 != 0);
  }
  ReadSequenceBuffer::~ReadSequenceBuffer(&local_70);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReadCacheItem> LongReadsMapper::create_read_paths(const std::vector<sgNodeID_t> &backbone, const std::vector<std::vector<LongReadMapping>> filtered_read_mappings, const ReadPathParams &read_path_params) {
    std::unordered_set<uint64_t> useful_read;
    std::vector<ReadCacheItem> read_cache;
    ReadSequenceBuffer sequenceGetter(datastore);
    for (uint32_t bn = 0; bn < backbone.size(); bn++) {
        for (const auto &read:reads_in_node[std::abs(backbone[bn])]) {
            const auto find_it = useful_read.find(read);
            if (find_it == useful_read.cend()) {
                useful_read.emplace(read);
                std::string seq = sequenceGetter.get_read_sequence(read);
                read_cache.emplace_back(read, seq);
            }

        }
    }
    
    // TODO: HACK! Move this to somewhere it makes more sense
    read_paths.resize(filtered_read_mappings.size());
    
#pragma omp parallel for
    for (uint32_t rcp = 0; rcp < read_cache.size(); rcp++) {
        read_paths[read_cache[rcp].id] = create_read_path(filtered_read_mappings[read_cache[rcp].id], read_path_params, false, read_cache[rcp].seq);
    }

    return read_cache;
}